

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall ot::commissioner::Interpreter::CancelCommand(Interpreter *this)

{
  element_type *this_00;
  ssize_t sVar1;
  int *piVar2;
  ssize_t result;
  Interpreter *pIStack_10;
  int cancelData;
  Interpreter *this_local;
  
  result._4_4_ = 1;
  pIStack_10 = this;
  this_00 = std::
            __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mJobManager);
  JobManager::CancelCommand(this_00);
  std::atomic<bool>::operator=(&this->mCancelCommand,true);
  sVar1 = read(this->mCancelPipe[0],(void *)((long)&result + 4),4);
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xb) {
      result._4_4_ = 0xffffffff;
      ::write(this->mCancelPipe[1],(void *)((long)&result + 4),4);
    }
  }
  return;
}

Assistant:

void Interpreter::CancelCommand()
{
    int cancelData = 1;
    mJobManager->CancelCommand();
    // For commands being handled in place
    mCancelCommand = true;

    // reading from non-blocking pipe to empty the one prior to
    // sending cancellation signal by writing to the pipe below
    if (read(mCancelPipe[0], &cancelData, sizeof(cancelData)) == -1 && errno == EAGAIN)
    {
        cancelData = -1;
        // No data in the pipe, write is safe (no overflow)
        ssize_t result = write(mCancelPipe[1], &cancelData, sizeof(cancelData));
        (void)result;
        // writing to the pipe results in invoking mdnsCancelEventQueue()
        // lambda and respectively breaking event loop
    }
}